

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::PushMessage(CConnman *this,CNode *pnode,CSerializedNetMsg *msg)

{
  long lVar1;
  pointer puVar2;
  _Head_base<0UL,_Transport_*,_false> _Var3;
  string_view source_file;
  bool bVar4;
  int iVar5;
  Logger *pLVar6;
  size_t sVar7;
  undefined4 extraout_var;
  uint64_t bytes;
  long *in_R9;
  long in_FS_OFFSET;
  string_view str;
  pair<unsigned_long,_bool> pVar8;
  string_view logging_function;
  Span<const_unsigned_char> __args_2;
  unsigned_long local_e8;
  size_t nMessageSize;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock103;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nMessageSize = (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = ::LogAcceptCategory(NET,Debug);
  if (bVar4) {
    local_e8 = pnode->id;
    pLVar6 = LogInstance();
    bVar4 = BCLog::Logger::Enabled(pLVar6);
    if (bVar4) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<std::__cxx11::string,unsigned_long,long>
                ((string *)&criticalblock103,(tinyformat *)"sending %s (%d bytes) peer=%d\n",
                 (char *)&msg->m_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nMessageSize,
                 &local_e8,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &criticalblock103);
      std::__cxx11::string::~string((string *)&criticalblock103);
      pLVar6 = LogInstance();
      criticalblock103.super_unique_lock._M_device = (mutex_type *)&DAT_00000050;
      criticalblock103.super_unique_lock._8_8_ = anon_var_dwarf_21b790c;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "PushMessage";
      logging_function._M_len = 0xb;
      BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0xefd,NET,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_msg,"-capturemessages",(allocator<char> *)&criticalblock103);
  bVar4 = ArgsManager::GetBoolArg(&gArgs,&log_msg,false);
  std::__cxx11::string::~string((string *)&log_msg);
  if (bVar4) {
    puVar2 = (msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __args_2.m_size =
         (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish - (long)puVar2;
    __args_2.m_data = puVar2;
    std::
    function<void_(const_CAddress_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Span<const_unsigned_char>,_bool)>
    ::operator()(&CaptureMessage_abi_cxx11_,&pnode->addr,&msg->m_type,__args_2,false);
  }
  bVar4 = false;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock103,&pnode->cs_vSend,"pnode->cs_vSend",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0xf0d,false);
  _Var3._M_head_impl =
       (pnode->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
       _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
       super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
  (*(_Var3._M_head_impl)->_vptr_Transport[7])(&log_msg,_Var3._M_head_impl,1);
  if (log_msg.field_2._8_8_ == 0) {
    bVar4 = (pnode->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            (pnode->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  }
  sVar7 = CSerializedNetMsg::GetMemoryUsage(msg);
  sVar7 = sVar7 + pnode->m_send_memusage;
  pnode->m_send_memusage = sVar7;
  iVar5 = (*((pnode->m_transport)._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[9])();
  if ((ulong)this->nSendBufferMaxSize < CONCAT44(extraout_var,iVar5) + sVar7) {
    LOCK();
    (pnode->fPauseSend)._M_base._M_i = true;
    UNLOCK();
  }
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::emplace_back<CSerializedNetMsg>
            (&pnode->vSendMsg,msg);
  if ((bVar4) && ((char)log_msg._M_string_length == '\x01')) {
    pVar8 = SocketSendData(this,pnode);
    bytes = pVar8.first;
  }
  else {
    bytes = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock103.super_unique_lock);
  if (bytes != 0) {
    RecordBytesSent(this,bytes);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::PushMessage(CNode* pnode, CSerializedNetMsg&& msg)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    size_t nMessageSize = msg.data.size();
    LogDebug(BCLog::NET, "sending %s (%d bytes) peer=%d\n", msg.m_type, nMessageSize, pnode->GetId());
    if (gArgs.GetBoolArg("-capturemessages", false)) {
        CaptureMessage(pnode->addr, msg.m_type, msg.data, /*is_incoming=*/false);
    }

    TRACE6(net, outbound_message,
        pnode->GetId(),
        pnode->m_addr_name.c_str(),
        pnode->ConnectionTypeAsString().c_str(),
        msg.m_type.c_str(),
        msg.data.size(),
        msg.data.data()
    );

    size_t nBytesSent = 0;
    {
        LOCK(pnode->cs_vSend);
        // Check if the transport still has unsent bytes, and indicate to it that we're about to
        // give it a message to send.
        const auto& [to_send, more, _msg_type] =
            pnode->m_transport->GetBytesToSend(/*have_next_message=*/true);
        const bool queue_was_empty{to_send.empty() && pnode->vSendMsg.empty()};

        // Update memory usage of send buffer.
        pnode->m_send_memusage += msg.GetMemoryUsage();
        if (pnode->m_send_memusage + pnode->m_transport->GetSendMemoryUsage() > nSendBufferMaxSize) pnode->fPauseSend = true;
        // Move message to vSendMsg queue.
        pnode->vSendMsg.push_back(std::move(msg));

        // If there was nothing to send before, and there is now (predicted by the "more" value
        // returned by the GetBytesToSend call above), attempt "optimistic write":
        // because the poll/select loop may pause for SELECT_TIMEOUT_MILLISECONDS before actually
        // doing a send, try sending from the calling thread if the queue was empty before.
        // With a V1Transport, more will always be true here, because adding a message always
        // results in sendable bytes there, but with V2Transport this is not the case (it may
        // still be in the handshake).
        if (queue_was_empty && more) {
            std::tie(nBytesSent, std::ignore) = SocketSendData(*pnode);
        }
    }
    if (nBytesSent) RecordBytesSent(nBytesSent);
}